

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O1

bool __thiscall QPMCache::insert(QPMCache *this,QString *key,QPixmap *pixmap,int cost)

{
  byte bVar1;
  Entry *pEVar2;
  KeyData *pKVar3;
  char cVar4;
  long in_FS_OFFSET;
  Key k;
  undefined1 local_50 [8];
  TryEmplaceResult local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  remove(this,(char *)key);
  local_50 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  insert((QPMCache *)local_50,(QPixmap *)this,(int)pixmap);
  if (local_50 == (undefined1  [8])0x0) {
    cVar4 = '\0';
  }
  else {
    cVar4 = *(bool *)((long)local_50 + 0x18);
  }
  if (cVar4 != '\0') {
    QString::operator=((QString *)local_50,key);
    QHash<QString,QPixmapCache::Key>::tryEmplace_impl<QString_const&>
              (&local_48,&this->cacheKeys,key);
    pEVar2 = (local_48.iterator.i.d)->spans[local_48.iterator.i.bucket >> 7].entries;
    bVar1 = (local_48.iterator.i.d)->spans[local_48.iterator.i.bucket >> 7].offsets
            [(uint)local_48.iterator.i.bucket & 0x7f];
    pKVar3 = *(KeyData **)(pEVar2[bVar1].storage.data + 0x18);
    *(undefined1 (*) [8])(pEVar2[bVar1].storage.data + 0x18) = local_50;
    local_50 = (undefined1  [8])pKVar3;
  }
  QPixmapCache::Key::~Key((Key *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QPMCache::insert(const QString& key, const QPixmap &pixmap, int cost)
{
    //If for the same key we add already a pixmap we should delete it
    remove(key);

    // this will create a new key; the old one has been removed
    auto k = insert(pixmap, cost);
    if (k.isValid()) {
        k.d->stringKey = key;
        cacheKeys[key] = std::move(k);
        return true;
    }
    return false;
}